

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O0

cmServerResponse * __thiscall
cmServerProtocol1::ProcessCodeModel
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  cmake *cm;
  Value local_80;
  allocator<char> local_41;
  string local_40;
  cmServerRequest *local_20;
  cmServerRequest *request_local;
  cmServerProtocol1 *this_local;
  
  local_20 = request;
  request_local = (cmServerRequest *)this;
  this_local = (cmServerProtocol1 *)__return_storage_ptr__;
  if (this->m_State == STATE_COMPUTED) {
    cm = cmServerProtocol::CMakeInstance(&this->super_cmServerProtocol);
    cmDumpCodeModel(&local_80,cm);
    cmServerRequest::Reply(__return_storage_ptr__,request,&local_80);
    Json::Value::~Value(&local_80);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"No build system was generated yet.",&local_41);
    cmServerRequest::ReportError(__return_storage_ptr__,request,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessCodeModel(
  const cmServerRequest& request)
{
  if (this->m_State != STATE_COMPUTED) {
    return request.ReportError("No build system was generated yet.");
  }

  return request.Reply(cmDumpCodeModel(this->CMakeInstance()));
}